

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall FailableMemoryAllocator::clearFailedAllocs(FailableMemoryAllocator *this)

{
  LocationToFailAllocNode *local_18;
  LocationToFailAllocNode *current;
  FailableMemoryAllocator *this_local;
  
  local_18 = this->head_;
  while (local_18 != (LocationToFailAllocNode *)0x0) {
    this->head_ = local_18->next_;
    (*(this->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
              (this,local_18,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x187);
    local_18 = this->head_;
  }
  this->currentAllocNumber_ = 0;
  return;
}

Assistant:

void FailableMemoryAllocator::clearFailedAllocs()
{
  LocationToFailAllocNode* current = head_;
  while (current) {
    head_ = current->next_;
    free_memory((char*) current, 0, __FILE__, __LINE__);
    current = head_;
  }
  currentAllocNumber_ = 0;
}